

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O3

int __thiscall smf::Options::getRegIndex(Options *this,string *optionName)

{
  int iVar1;
  _Rb_tree_color _Var2;
  iterator iVar3;
  ostream *poVar4;
  
  if ((this->m_suppressQ == true) &&
     (iVar1 = std::__cxx11::string::compare((char *)optionName), iVar1 == 0)) {
    return -1;
  }
  iVar1 = std::__cxx11::string::compare((char *)optionName);
  if (iVar1 == 0) {
    print(this,(ostream *)&std::cout);
    exit(0);
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::find(&(this->m_optionList)._M_t,optionName);
  if ((_Rb_tree_header *)iVar3._M_node == &(this->m_optionList)._M_t._M_impl.super__Rb_tree_header)
  {
    _Var2 = ~_S_red;
    if (this->m_options_error_check != 0) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error: unknown option \"");
      poVar4 = std::operator<<(poVar4,(string *)optionName);
      poVar4 = std::operator<<(poVar4,"\".");
      std::endl<char,std::char_traits<char>>(poVar4);
      print(this,(ostream *)&std::cout);
      exit(1);
    }
  }
  else {
    _Var2 = iVar3._M_node[2]._M_color;
  }
  return _Var2;
}

Assistant:

int Options::getRegIndex(const std::string& optionName) {
	if (m_suppressQ && (optionName == "options")) {
			return -1;
	}

	if (optionName == "options") {
		print(std::cout);
		exit(0);
	}


	auto it = m_optionList.find(optionName);
	if (it == m_optionList.end()) {
		if (m_options_error_check) {
			std::cerr << "Error: unknown option \"" << optionName << "\"." << std::endl;
			print(std::cout);
			exit(1);
		} else {
			return -1;
		}
	} else {
		return it->second;
	}
}